

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall
CppGenerator::genGroupRelationOrdering
          (CppGenerator *this,string *rel_name,size_t *depth,size_t *group_id)

{
  element_type *peVar1;
  CppGenerator *this_00;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_type *in_RCX;
  long in_RSI;
  string *in_RDI;
  long *in_R8;
  size_t viewID_2;
  size_t off;
  string secondID;
  string second;
  size_t viewID;
  size_t viewID_1;
  string firstID;
  string first;
  size_t numberContributing;
  size_t idx;
  string depthString;
  string attrType;
  string *attr_name;
  Attribute *attr;
  string *res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe978;
  TreeDecomposition *in_stack_ffffffffffffe980;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  size_t in_stack_ffffffffffffe9a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  CppGenerator *in_stack_ffffffffffffe9a8;
  Type t;
  string local_1620 [32];
  string local_1600 [32];
  string local_15e0 [32];
  string local_15c0 [32];
  string local_15a0 [32];
  string local_1580 [32];
  string local_1560 [32];
  string local_1540 [32];
  string local_1520 [32];
  string local_1500 [32];
  string local_14e0 [32];
  string local_14c0 [32];
  string local_14a0 [32];
  string local_1480 [32];
  string local_1460 [32];
  string local_1440 [32];
  string local_1420 [32];
  string local_1400 [32];
  string local_13e0 [32];
  string local_13c0 [32];
  string local_13a0 [32];
  string local_1380 [32];
  string local_1360 [32];
  string local_1340 [32];
  string local_1320 [32];
  string local_1300 [32];
  string local_12e0 [32];
  string local_12c0 [32];
  string local_12a0 [32];
  string local_1280 [32];
  string local_1260 [32];
  string local_1240 [32];
  string local_1220 [32];
  string local_1200 [32];
  string local_11e0 [32];
  string local_11c0 [32];
  string local_11a0 [32];
  string local_1180 [32];
  string local_1160 [32];
  string local_1140 [32];
  string local_1120 [32];
  string local_1100 [32];
  string local_10e0 [32];
  string local_10c0 [32];
  string local_10a0 [32];
  string local_1080 [32];
  string local_1060 [32];
  string local_1040 [32];
  string local_1020 [32];
  string local_1000 [32];
  string local_fe0 [32];
  string local_fc0 [32];
  string local_fa0 [32];
  string local_f80 [32];
  string local_f60 [32];
  value_type local_f40;
  string local_f38 [32];
  string local_f18 [32];
  string local_ef8 [32];
  string local_ed8 [32];
  string local_eb8 [32];
  string local_e98 [32];
  string local_e78 [32];
  string local_e58 [32];
  string local_e38 [32];
  string local_e18 [32];
  string local_df8 [32];
  string local_dd8 [32];
  string local_db8 [32];
  ulong local_d98;
  string local_d90 [32];
  string local_d70 [32];
  string local_d50 [32];
  string local_d30 [32];
  string local_d10 [32];
  string local_cf0 [32];
  string local_cd0 [32];
  string local_cb0 [32];
  string local_c90 [32];
  string local_c70 [32];
  string local_c50 [32];
  string local_c30 [32];
  string local_c10 [32];
  string local_bf0 [32];
  string local_bd0 [32];
  string local_bb0 [32];
  string local_b90 [32];
  string local_b70 [32];
  string local_b50 [32];
  string local_b30 [32];
  string local_b10 [32];
  string local_af0 [32];
  string local_ad0 [32];
  string local_ab0 [32];
  string local_a90 [32];
  string local_a70 [32];
  string local_a50 [32];
  string local_a30 [32];
  string local_a10 [32];
  string local_9f0 [32];
  string local_9d0 [32];
  string local_9b0 [32];
  string local_990 [32];
  string local_970 [32];
  string local_950 [32];
  string local_930 [32];
  string local_910 [32];
  string local_8f0 [32];
  string local_8d0 [32];
  string local_8b0 [32];
  string local_890 [32];
  string local_870 [32];
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  string local_750 [32];
  string local_730 [32];
  string local_710 [32];
  string local_6f0 [32];
  string local_6d0 [32];
  string local_6b0 [32];
  string local_690 [32];
  string local_670 [32];
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [32];
  string local_590 [32];
  string local_570 [32];
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0 [32];
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  value_type local_2d0;
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  value_type local_1e8;
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  value_type local_c0;
  size_type local_b8;
  string local_b0 [32];
  string local_90 [32];
  string *local_70;
  CppGenerator *local_68;
  string local_50 [39];
  byte local_29;
  long *local_28;
  size_type *local_20;
  
  local_29 = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  offset_abi_cxx11_(in_stack_ffffffffffffe9a8,in_stack_ffffffffffffe9a0);
  std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
  std::__cxx11::string::~string(local_50);
  peVar1 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2dbde5);
  t = (Type)((ulong)peVar1 >> 0x20);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             (*(long *)(in_RSI + 0xb8) + *local_28 * 0x18),*local_20);
  local_68 = (CppGenerator *)
             TreeDecomposition::getAttribute
                       (in_stack_ffffffffffffe980,(size_t)in_stack_ffffffffffffe978);
  local_70 = &local_68->_pathToData;
  typeToStr_abi_cxx11_(local_68,t);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe9a8);
  __rhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_20;
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2dbea8);
  this_00 = (CppGenerator *)QueryCompiler::numberOfViews((QueryCompiler *)0x2dbeb0);
  local_b8 = (long)__rhs_00 * (long)((long)&(this_00->super_CodeGenerator)._vptr_CodeGenerator + 2);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      (*(long *)(in_RSI + 200) + *local_28 * 0x18),local_b8);
  local_c0 = *pvVar2;
  if (local_c0 == 2) {
    std::__cxx11::string::string(local_e0);
    std::__cxx11::string::string(local_100);
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        (*(long *)(in_RSI + 200) + *local_28 * 0x18),local_b8 + 1);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*pvVar2;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2dbf72);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            QueryCompiler::numberOfViews((QueryCompiler *)0x2dbf7a);
    if (__rhs == __lhs) {
      std::operator+(__lhs,(char *)__rhs);
      std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
      std::__cxx11::string::operator=(local_e0,local_120);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_160);
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::~string(local_1c0);
      std::operator+(__lhs,(char *)__rhs);
      std::__cxx11::string::operator=(local_100,local_1e0);
      std::__cxx11::string::~string(local_1e0);
    }
    else {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          (*(long *)(in_RSI + 200) + *local_28 * 0x18),local_b8 + 1);
      local_1e8 = *pvVar2;
      std::operator+(__lhs,(char *)__rhs);
      std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
      this_01 = local_208;
      std::__cxx11::string::operator=(local_e0,this_01);
      std::__cxx11::string::~string(this_01);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::string::~string(local_288);
      std::__cxx11::string::~string(local_2a8);
      std::operator+(__lhs,(char *)__rhs);
      std::__cxx11::string::operator=(local_100,local_2c8);
      std::__cxx11::string::~string(local_2c8);
    }
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        (*(long *)(in_RSI + 200) + *local_28 * 0x18),local_b8 + 2);
    local_2d0 = *pvVar2;
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::__cxx11::string::~string(local_310);
    std::__cxx11::string::~string(local_330);
    std::__cxx11::string::~string(local_350);
    std::__cxx11::string::~string(local_370);
    std::__cxx11::string::~string(local_390);
    std::operator+(__lhs,(char *)__rhs);
    offset_abi_cxx11_(this_00,(size_t)__rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::__cxx11::to_string((unsigned_long)this_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    offset_abi_cxx11_(this_00,(size_t)__rhs_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    offset_abi_cxx11_(this_00,(size_t)__rhs_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    offset_abi_cxx11_(this_00,(size_t)__rhs_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    offset_abi_cxx11_(this_00,(size_t)__rhs_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    offset_abi_cxx11_(this_00,(size_t)__rhs_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    offset_abi_cxx11_(this_00,(size_t)__rhs_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    offset_abi_cxx11_(this_00,(size_t)__rhs_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    offset_abi_cxx11_(this_00,(size_t)__rhs_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    offset_abi_cxx11_(this_00,(size_t)__rhs_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    offset_abi_cxx11_(this_00,(size_t)__rhs_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::__cxx11::string::operator+=((string *)in_RDI,local_3d0);
    std::__cxx11::string::~string(local_3d0);
    std::__cxx11::string::~string(local_3f0);
    std::__cxx11::string::~string(local_c10);
    std::__cxx11::string::~string(local_410);
    std::__cxx11::string::~string(local_430);
    std::__cxx11::string::~string(local_450);
    std::__cxx11::string::~string(local_470);
    std::__cxx11::string::~string(local_490);
    std::__cxx11::string::~string(local_4b0);
    std::__cxx11::string::~string(local_4d0);
    std::__cxx11::string::~string(local_4f0);
    std::__cxx11::string::~string(local_bf0);
    std::__cxx11::string::~string(local_510);
    std::__cxx11::string::~string(local_530);
    std::__cxx11::string::~string(local_550);
    std::__cxx11::string::~string(local_570);
    std::__cxx11::string::~string(local_590);
    std::__cxx11::string::~string(local_5b0);
    std::__cxx11::string::~string(local_5d0);
    std::__cxx11::string::~string(local_5f0);
    std::__cxx11::string::~string(local_bd0);
    std::__cxx11::string::~string(local_610);
    std::__cxx11::string::~string(local_630);
    std::__cxx11::string::~string(local_bb0);
    std::__cxx11::string::~string(local_650);
    std::__cxx11::string::~string(local_670);
    std::__cxx11::string::~string(local_b90);
    std::__cxx11::string::~string(local_690);
    std::__cxx11::string::~string(local_6b0);
    std::__cxx11::string::~string(local_b70);
    std::__cxx11::string::~string(local_6d0);
    std::__cxx11::string::~string(local_6f0);
    std::__cxx11::string::~string(local_710);
    std::__cxx11::string::~string(local_730);
    std::__cxx11::string::~string(local_750);
    std::__cxx11::string::~string(local_770);
    std::__cxx11::string::~string(local_790);
    std::__cxx11::string::~string(local_7b0);
    std::__cxx11::string::~string(local_b50);
    std::__cxx11::string::~string(local_7d0);
    std::__cxx11::string::~string(local_7f0);
    std::__cxx11::string::~string(local_810);
    std::__cxx11::string::~string(local_830);
    std::__cxx11::string::~string(local_850);
    std::__cxx11::string::~string(local_870);
    std::__cxx11::string::~string(local_890);
    std::__cxx11::string::~string(local_8b0);
    std::__cxx11::string::~string(local_b30);
    std::__cxx11::string::~string(local_8d0);
    std::__cxx11::string::~string(local_8f0);
    std::__cxx11::string::~string(local_b10);
    std::__cxx11::string::~string(local_910);
    std::__cxx11::string::~string(local_930);
    std::__cxx11::string::~string(local_950);
    std::__cxx11::string::~string(local_970);
    std::__cxx11::string::~string(local_990);
    std::__cxx11::string::~string(local_9b0);
    std::__cxx11::string::~string(local_af0);
    std::__cxx11::string::~string(local_9d0);
    std::__cxx11::string::~string(local_9f0);
    std::__cxx11::string::~string(local_ad0);
    std::__cxx11::string::~string(local_a10);
    std::__cxx11::string::~string(local_a30);
    std::__cxx11::string::~string(local_a50);
    std::__cxx11::string::~string(local_a70);
    std::__cxx11::string::~string(local_a90);
    std::__cxx11::string::~string(local_ab0);
    std::__cxx11::string::~string(local_3b0);
    std::__cxx11::string::~string(local_2f0);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_e0);
  }
  else {
    offset_abi_cxx11_(this_00,(size_t)__rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::__cxx11::to_string((unsigned_long)this_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    offset_abi_cxx11_(this_00,(size_t)__rhs_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::__cxx11::string::operator+=((string *)in_RDI,local_c30);
    std::__cxx11::string::~string(local_c30);
    std::__cxx11::string::~string(local_c50);
    std::__cxx11::string::~string(local_d90);
    std::__cxx11::string::~string(local_c70);
    std::__cxx11::string::~string(local_c90);
    std::__cxx11::string::~string(local_d70);
    std::__cxx11::string::~string(local_cb0);
    std::__cxx11::string::~string(local_cd0);
    std::__cxx11::string::~string(local_cf0);
    std::__cxx11::string::~string(local_d10);
    std::__cxx11::string::~string(local_d30);
    std::__cxx11::string::~string(local_d50);
    local_d98 = 1;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        (*(long *)(in_RSI + 200) + *local_28 * 0x18),local_b8 + 1);
    in_stack_ffffffffffffe970 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*pvVar2;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2ddf9a);
    in_stack_ffffffffffffe978 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         QueryCompiler::numberOfViews((QueryCompiler *)0x2ddfa2);
    if (in_stack_ffffffffffffe970 == in_stack_ffffffffffffe978) {
      offset_abi_cxx11_(this_00,(size_t)__rhs_00);
      std::operator+((char *)in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
      std::__cxx11::string::operator+=((string *)in_RDI,local_db8);
      std::__cxx11::string::~string(local_db8);
      std::__cxx11::string::~string(local_dd8);
      std::__cxx11::string::~string(local_df8);
      std::__cxx11::string::~string(local_e18);
      std::__cxx11::string::~string(local_e38);
      std::__cxx11::string::~string(local_e58);
      std::__cxx11::string::~string(local_e78);
      std::__cxx11::string::~string(local_e98);
      std::__cxx11::string::~string(local_eb8);
      std::__cxx11::string::~string(local_ed8);
      std::__cxx11::string::~string(local_ef8);
      std::__cxx11::string::~string(local_f18);
      std::__cxx11::string::~string(local_f38);
      local_d98 = 2;
    }
    for (; local_d98 <= local_c0; local_d98 = local_d98 + 1) {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          (*(long *)(in_RSI + 200) + *local_28 * 0x18),local_b8 + local_d98);
      local_f40 = *pvVar2;
      offset_abi_cxx11_(this_00,(size_t)__rhs_00);
      std::operator+((char *)in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
      std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
      std::__cxx11::string::operator+=((string *)in_RDI,local_f60);
      std::__cxx11::string::~string(local_f60);
      std::__cxx11::string::~string(local_f80);
      std::__cxx11::string::~string(local_fa0);
      std::__cxx11::string::~string(local_fc0);
      std::__cxx11::string::~string(local_fe0);
      std::__cxx11::string::~string(local_1000);
      std::__cxx11::string::~string(local_1020);
      std::__cxx11::string::~string(local_1040);
      std::__cxx11::string::~string(local_1060);
      std::__cxx11::string::~string(local_1080);
      std::__cxx11::string::~string(local_10a0);
      std::__cxx11::string::~string(local_10c0);
      std::__cxx11::string::~string(local_10e0);
    }
    std::__cxx11::string::pop_back();
    offset_abi_cxx11_(this_00,(size_t)__rhs_00);
    std::operator+((char *)in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::__cxx11::string::operator+=((string *)in_RDI,local_1100);
    std::__cxx11::string::~string(local_1100);
    std::__cxx11::string::~string(local_1120);
    std::__cxx11::string::~string(local_1140);
    offset_abi_cxx11_(this_00,(size_t)__rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::__cxx11::to_string((unsigned_long)this_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    offset_abi_cxx11_(this_00,(size_t)__rhs_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    offset_abi_cxx11_(this_00,(size_t)__rhs_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    offset_abi_cxx11_(this_00,(size_t)__rhs_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs_00);
    std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
    std::__cxx11::string::operator+=((string *)in_RDI,local_1160);
    std::__cxx11::string::~string(local_1160);
    std::__cxx11::string::~string(local_1180);
    std::__cxx11::string::~string(local_1400);
    std::__cxx11::string::~string(local_11a0);
    std::__cxx11::string::~string(local_11c0);
    std::__cxx11::string::~string(local_13e0);
    std::__cxx11::string::~string(local_11e0);
    std::__cxx11::string::~string(local_1200);
    std::__cxx11::string::~string(local_13c0);
    std::__cxx11::string::~string(local_1220);
    std::__cxx11::string::~string(local_1240);
    std::__cxx11::string::~string(local_1260);
    std::__cxx11::string::~string(local_1280);
    std::__cxx11::string::~string(local_12a0);
    std::__cxx11::string::~string(local_12c0);
    std::__cxx11::string::~string(local_13a0);
    std::__cxx11::string::~string(local_12e0);
    std::__cxx11::string::~string(local_1300);
    std::__cxx11::string::~string(local_1320);
    std::__cxx11::string::~string(local_1340);
    std::__cxx11::string::~string(local_1360);
    std::__cxx11::string::~string(local_1380);
  }
  offset_abi_cxx11_(this_00,(size_t)__rhs_00);
  std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
  std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
  std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
  std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
  std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
  std::__cxx11::string::operator+=((string *)in_RDI,local_1420);
  std::__cxx11::string::~string(local_1420);
  std::__cxx11::string::~string(local_1440);
  std::__cxx11::string::~string(local_1460);
  std::__cxx11::string::~string(local_1480);
  std::__cxx11::string::~string(local_14a0);
  std::__cxx11::string::~string(local_14c0);
  offset_abi_cxx11_(this_00,(size_t)__rhs_00);
  std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
  std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
  std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
  std::operator+(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
  std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
  std::__cxx11::to_string((unsigned_long)this_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 __rhs_00);
  std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
  std::__cxx11::string::operator+=((string *)in_RDI,local_14e0);
  std::__cxx11::string::~string(local_14e0);
  std::__cxx11::string::~string(local_1500);
  std::__cxx11::string::~string(local_15e0);
  std::__cxx11::string::~string(local_1520);
  std::__cxx11::string::~string(local_1540);
  std::__cxx11::string::~string(local_1560);
  std::__cxx11::string::~string(local_1580);
  std::__cxx11::string::~string(local_15a0);
  std::__cxx11::string::~string(local_15c0);
  offset_abi_cxx11_(this_00,(size_t)__rhs_00);
  std::operator+(in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970);
  std::__cxx11::string::operator+=((string *)in_RDI,local_1600);
  std::__cxx11::string::~string(local_1600);
  std::__cxx11::string::~string(local_1620);
  local_29 = 1;
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_90);
  if ((local_29 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string CppGenerator::genGroupRelationOrdering(
    const std::string& rel_name, const size_t& depth, const size_t& group_id)
{
    // TODO: FIXME: add the case when there is only two or one reations
    std::string res = offset(2+depth)+
        "/*********** ORDERING RELATIONS *************/\n";

    Attribute* attr = _td->getAttribute(groupVariableOrder[group_id][depth]);

    const std::string& attr_name = attr->_name;
    const std::string attrType = typeToStr(attr->_type);
    const std::string depthString = std::to_string(depth);
    
    size_t idx = depth * (_qc->numberOfViews() + 2);
    size_t numberContributing = groupViewsPerVarInfo[group_id][idx];

    if (numberContributing == 2)
    {
        std::string first, firstID;
        if (groupViewsPerVarInfo[group_id][idx+1] == _qc->numberOfViews())
        {    
            first = rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name;
            firstID = rel_name+"_ID";
        }
        else
        {
            size_t viewID = groupViewsPerVarInfo[group_id][idx+1];
            first = viewName[viewID]+"[lowerptr_"+viewName[viewID]+
                "["+depthString+"]]."+attr_name;
            firstID = viewName[viewID]+"_ID";
        }
        size_t viewID = groupViewsPerVarInfo[group_id][idx+2];
        std::string second = viewName[viewID]+"[lowerptr_"+viewName[viewID]+
                "["+depthString+"]]."+attr_name;
        std::string secondID = viewName[viewID]+"_ID";

        res += offset(2+depth)+"std::pair<"+attrType+", int> order_"+attr_name+"["+
            std::to_string(numberContributing)+"];\n"+
            offset(2+depth)+"if("+first+" < "+second+")\n"+offset(2+depth)+"{\n"+
            offset(3+depth)+"order_"+attr_name+"[0] = std::make_pair("+first+", "+
            firstID+");\n"+
            offset(3+depth)+"order_"+attr_name+"[1] = std::make_pair("+second+", "+
            secondID+");\n"+
            offset(2+depth)+"}\n"+
            offset(2+depth)+"else\n"+offset(2+depth)+"{\n"+
            offset(3+depth)+"order_"+attr_name+"[0] = std::make_pair("+second+", "+
            secondID+");\n"+
            offset(3+depth)+"order_"+attr_name+"[1] = std::make_pair("+first+", "+
            firstID+");\n"+
            offset(2+depth)+"}\n";
    }
    else
    {
        res += offset(2+depth)+"std::pair<"+attrType+", int> order_"+attr_name+"["+
            std::to_string(numberContributing)+"] = \n"+
            offset(3+depth)+"{";
        
        size_t off = 1;
        if (groupViewsPerVarInfo[group_id][idx+1] == _qc->numberOfViews())
        {
            res += "\n"+offset(4+depth)+"std::make_pair("+rel_name+
                "[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+", "+
                rel_name+"_ID),";
            off = 2;
        }
        
        for (; off <= numberContributing; ++off)
        {
            size_t viewID = groupViewsPerVarInfo[group_id][idx+off];
            res += "\n"+offset(4+depth)+"std::make_pair("+viewName[viewID]+
                "[lowerptr_"+viewName[viewID]+"["+depthString+"]]."+
                attr_name+", "+viewName[viewID]+"_ID),";
        }
        res.pop_back();
        res += "\n"+offset(3+depth)+"};\n";
    
        res += offset(2+depth)+"std::sort(order_"+attr_name+", order_"+attr_name+
            " + "+std::to_string(numberContributing)+",[](const std::pair<"+
            attrType+",int> &lhs, const std::pair<"+attrType+",int> &rhs)\n"+
            offset(3+depth)+"{\n"+offset(4+depth)+"return lhs.first < rhs.first;\n"+
            offset(3+depth)+"});\n";
    }
    

    res += offset(2+depth)+"min_"+attr_name+" = order_"+attr_name+"[0].first;\n";
    res += offset(2+depth)+"max_"+attr_name+" = order_"+attr_name+"["+
        std::to_string(numberContributing-1)+"].first;\n";

    res += offset(2+depth)+"/*********** ORDERING RELATIONS *************/\n";
    return res;
}